

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chrono-test.cc
# Opt level: O1

void __thiscall ChronoTest_Align_Test::TestBody(ChronoTest_Align_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  char *pcVar3;
  basic_string_view<char> format_str;
  basic_string_view<char> format_str_00;
  basic_string_view<char> format_str_01;
  basic_string_view<char> format_str_02;
  basic_string_view<char> format_str_03;
  basic_string_view<char> format_str_04;
  basic_string_view<char> format_str_05;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_00;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_01;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_02;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_03;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_04;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_05;
  AssertionResult gtest_ar;
  seconds s;
  internal local_2b8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  char local_280 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_250;
  undefined1 *local_248;
  long lStack_240;
  undefined8 local_238;
  undefined1 local_230 [504];
  char local_38 [8];
  
  local_38[0] = '*';
  local_38[1] = '\0';
  local_38[2] = '\0';
  local_38[3] = '\0';
  local_38[4] = '\0';
  local_38[5] = '\0';
  local_38[6] = '\0';
  local_38[7] = '\0';
  local_278._M_string_length =
       (size_type)
       fmt::v5::internal::
       value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
       ::format_custom_arg<std::chrono::duration<long,std::ratio<1l,1l>>>;
  lStack_240 = 0;
  local_250.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_00182020
  ;
  local_238 = 500;
  format_str.size_ = 4;
  format_str.data_ = "{:5}";
  args.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_278;
  args.types_ = fmt::v5::
                format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,std::chrono::duration<long,std::ratio<1l,1l>>>
                ::TYPES;
  local_278._M_dataplus._M_p = local_38;
  local_248 = local_230;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_250,format_str,args,(locale_ref)0x0);
  paVar1 = &local_2a8.field_2;
  local_2a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2a8,local_248,local_248 + lStack_240);
  local_250.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_00182020
  ;
  if (local_248 != local_230) {
    operator_delete(local_248);
  }
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            (local_2b8,"\"42s  \"","fmt::format(\"{:5}\", s)",(char (*) [6])"42s  ",&local_2a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2a8._M_dataplus._M_p);
  }
  if (local_2b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_250);
    if (local_2b0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_2b0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
               ,0x60,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2a8,(Message *)&local_250);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2a8);
    if (local_250.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_250.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_250.ptr_ + 8))();
      }
      local_250.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_2a8._M_string_length =
       (size_type)
       fmt::v5::internal::
       value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
       ::format_custom_arg<std::chrono::duration<long,std::ratio<1l,1l>>>;
  local_2a8.field_2._M_allocated_capacity = 5;
  lStack_240 = 0;
  local_250.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_00182020
  ;
  local_238 = 500;
  format_str_00.size_ = 5;
  format_str_00.data_ = "{:{}}";
  args_00.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_2a8;
  args_00.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,std::chrono::duration<long,std::ratio<1l,1l>>,int>
       ::TYPES;
  local_2a8._M_dataplus._M_p = local_38;
  local_248 = local_230;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_250,format_str_00,args_00,(locale_ref)0x0);
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_278,local_248,local_248 + lStack_240);
  local_250.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_00182020
  ;
  if (local_248 != local_230) {
    operator_delete(local_248);
  }
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            (local_2b8,"\"42s  \"","fmt::format(\"{:{}}\", s, 5)",(char (*) [6])"42s  ",&local_278);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p);
  }
  if (local_2b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_250);
    if (local_2b0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_2b0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
               ,0x61,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2a8,(Message *)&local_250);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2a8);
    if (local_250.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_250.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_250.ptr_ + 8))();
      }
      local_250.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_278._M_string_length =
       (size_type)
       fmt::v5::internal::
       value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
       ::format_custom_arg<std::chrono::duration<long,std::ratio<1l,1l>>>;
  lStack_240 = 0;
  local_250.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_00182020
  ;
  local_238 = 500;
  format_str_01.size_ = 5;
  format_str_01.data_ = "{:>5}";
  args_01.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_278;
  args_01.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,std::chrono::duration<long,std::ratio<1l,1l>>>
       ::TYPES;
  local_278._M_dataplus._M_p = local_38;
  local_248 = local_230;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_250,format_str_01,args_01,(locale_ref)0x0);
  local_2a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2a8,local_248,local_248 + lStack_240);
  local_250.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_00182020
  ;
  if (local_248 != local_230) {
    operator_delete(local_248);
  }
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            (local_2b8,"\"  42s\"","fmt::format(\"{:>5}\", s)",(char (*) [6])"  42s",&local_2a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2a8._M_dataplus._M_p);
  }
  if (local_2b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_250);
    if (local_2b0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_2b0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
               ,0x62,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2a8,(Message *)&local_250);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2a8);
    if (local_250.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_250.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_250.ptr_ + 8))();
      }
      local_250.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_278._M_string_length =
       (size_type)
       fmt::v5::internal::
       value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
       ::format_custom_arg<std::chrono::duration<long,std::ratio<1l,1l>>>;
  lStack_240 = 0;
  local_250.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_00182020
  ;
  local_238 = 500;
  format_str_02.size_ = 6;
  format_str_02.data_ = "{:*^7}";
  args_02.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_278;
  args_02.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,std::chrono::duration<long,std::ratio<1l,1l>>>
       ::TYPES;
  local_278._M_dataplus._M_p = local_38;
  local_248 = local_230;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_250,format_str_02,args_02,(locale_ref)0x0);
  local_2a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2a8,local_248,local_248 + lStack_240);
  local_250.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_00182020
  ;
  if (local_248 != local_230) {
    operator_delete(local_248);
  }
  testing::internal::CmpHelperEQ<char[8],std::__cxx11::string>
            (local_2b8,"\"**42s**\"","fmt::format(\"{:*^7}\", s)",(char (*) [8])"**42s**",&local_2a8
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2a8._M_dataplus._M_p);
  }
  if (local_2b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_250);
    if (local_2b0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_2b0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
               ,99,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2a8,(Message *)&local_250);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2a8);
    if (local_250.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_250.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_250.ptr_ + 8))();
      }
      local_250.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_280[0] = '9';
  local_280[1] = '0';
  local_280[2] = '\0';
  local_280[3] = '\0';
  local_280[4] = '\0';
  local_280[5] = '\0';
  local_280[6] = '\0';
  local_280[7] = '\0';
  local_278._M_string_length =
       (size_type)
       fmt::v5::internal::
       value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
       ::format_custom_arg<std::chrono::duration<long,std::ratio<1l,1l>>>;
  lStack_240 = 0;
  local_250.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_00182020
  ;
  local_238 = 500;
  format_str_03.size_ = 0xd;
  format_str_03.data_ = "{:12%H:%M:%S}";
  args_03.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_278;
  args_03.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,std::chrono::duration<long,std::ratio<1l,1l>>>
       ::TYPES;
  local_278._M_dataplus._M_p = local_280;
  local_248 = local_230;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_250,format_str_03,args_03,(locale_ref)0x0);
  local_2a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2a8,local_248,local_248 + lStack_240);
  local_250.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_00182020
  ;
  if (local_248 != local_230) {
    operator_delete(local_248);
  }
  testing::internal::CmpHelperEQ<char[13],std::__cxx11::string>
            (local_2b8,"\"03:25:45    \"",
             "fmt::format(\"{:12%H:%M:%S}\", std::chrono::seconds(12345))",
             (char (*) [13])"03:25:45    ",&local_2a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2a8._M_dataplus._M_p);
  }
  if (local_2b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_250);
    if (local_2b0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_2b0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
               ,0x65,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2a8,(Message *)&local_250);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2a8);
    if (local_250.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_250.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_250.ptr_ + 8))();
      }
      local_250.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_280[0] = '9';
  local_280[1] = '0';
  local_280[2] = '\0';
  local_280[3] = '\0';
  local_280[4] = '\0';
  local_280[5] = '\0';
  local_280[6] = '\0';
  local_280[7] = '\0';
  local_278._M_string_length =
       (size_type)
       fmt::v5::internal::
       value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
       ::format_custom_arg<std::chrono::duration<long,std::ratio<1l,1l>>>;
  lStack_240 = 0;
  local_250.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_00182020
  ;
  local_238 = 500;
  format_str_04.size_ = 0xe;
  format_str_04.data_ = "{:>12%H:%M:%S}";
  args_04.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_278;
  args_04.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,std::chrono::duration<long,std::ratio<1l,1l>>>
       ::TYPES;
  local_278._M_dataplus._M_p = local_280;
  local_248 = local_230;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_250,format_str_04,args_04,(locale_ref)0x0);
  local_2a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2a8,local_248,local_248 + lStack_240);
  local_250.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_00182020
  ;
  if (local_248 != local_230) {
    operator_delete(local_248);
  }
  testing::internal::CmpHelperEQ<char[13],std::__cxx11::string>
            (local_2b8,"\"    03:25:45\"",
             "fmt::format(\"{:>12%H:%M:%S}\", std::chrono::seconds(12345))",
             (char (*) [13])"    03:25:45",&local_2a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2a8._M_dataplus._M_p);
  }
  if (local_2b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_250);
    if (local_2b0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_2b0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
               ,0x67,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2a8,(Message *)&local_250);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2a8);
    if (local_250.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_250.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_250.ptr_ + 8))();
      }
      local_250.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_280[0] = '9';
  local_280[1] = '0';
  local_280[2] = '\0';
  local_280[3] = '\0';
  local_280[4] = '\0';
  local_280[5] = '\0';
  local_280[6] = '\0';
  local_280[7] = '\0';
  local_278._M_string_length =
       (size_type)
       fmt::v5::internal::
       value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
       ::format_custom_arg<std::chrono::duration<long,std::ratio<1l,1l>>>;
  lStack_240 = 0;
  local_250.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_00182020
  ;
  local_238 = 500;
  format_str_05.size_ = 0xf;
  format_str_05.data_ = "{:~^12%H:%M:%S}";
  args_05.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_278;
  args_05.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,std::chrono::duration<long,std::ratio<1l,1l>>>
       ::TYPES;
  local_278._M_dataplus._M_p = local_280;
  local_248 = local_230;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_250,format_str_05,args_05,(locale_ref)0x0);
  local_2a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2a8,local_248,local_248 + lStack_240);
  local_250.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_00182020
  ;
  if (local_248 != local_230) {
    operator_delete(local_248);
  }
  testing::internal::CmpHelperEQ<char[13],std::__cxx11::string>
            (local_2b8,"\"~~03:25:45~~\"",
             "fmt::format(\"{:~^12%H:%M:%S}\", std::chrono::seconds(12345))",
             (char (*) [13])"~~03:25:45~~",&local_2a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2a8._M_dataplus._M_p);
  }
  if (local_2b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_250);
    if (local_2b0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_2b0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
               ,0x69,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2a8,(Message *)&local_250);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2a8);
    if (local_250.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_250.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_250.ptr_ + 8))();
      }
      local_250.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(ChronoTest, Align) {
  auto s = std::chrono::seconds(42);
  EXPECT_EQ("42s  ", fmt::format("{:5}", s));
  EXPECT_EQ("42s  ", fmt::format("{:{}}", s, 5));
  EXPECT_EQ("  42s", fmt::format("{:>5}", s));
  EXPECT_EQ("**42s**", fmt::format("{:*^7}", s));
  EXPECT_EQ("03:25:45    ",
            fmt::format("{:12%H:%M:%S}", std::chrono::seconds(12345)));
  EXPECT_EQ("    03:25:45",
            fmt::format("{:>12%H:%M:%S}", std::chrono::seconds(12345)));
  EXPECT_EQ("~~03:25:45~~",
            fmt::format("{:~^12%H:%M:%S}", std::chrono::seconds(12345)));

}